

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_scratch_tests(void)

{
  secp256k1_scratch_space *error_callback;
  size_t sVar1;
  void *pvVar2;
  secp256k1_scratch_space local_scratch;
  secp256k1_scratch_space *scratch;
  size_t checkpoint_2;
  size_t checkpoint;
  int32_t ecount;
  size_t adj_alloc;
  secp256k1_scratch *in_stack_ffffffffffffffb8;
  secp256k1_context *in_stack_ffffffffffffffc0;
  secp256k1_callback *in_stack_ffffffffffffffc8;
  secp256k1_scratch *in_stack_ffffffffffffffd0;
  
  secp256k1_context_set_illegal_callback
            (in_stack_ffffffffffffffc0,(_func_void_char_ptr_void_ptr *)in_stack_ffffffffffffffb8,
             (void *)0x110d6d);
  secp256k1_context_set_error_callback
            (in_stack_ffffffffffffffc0,(_func_void_char_ptr_void_ptr *)in_stack_ffffffffffffffb8,
             (void *)0x110d85);
  error_callback =
       secp256k1_scratch_space_create(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
  if (error_callback == (secp256k1_scratch_space *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x20e,"test condition failed: scratch != NULL");
    abort();
  }
  sVar1 = secp256k1_scratch_max_allocation
                    (in_stack_ffffffffffffffc8,(secp256k1_scratch *)in_stack_ffffffffffffffc0,
                     (size_t)in_stack_ffffffffffffffb8);
  if (sVar1 != 1000) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x212,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000"
           );
    abort();
  }
  sVar1 = secp256k1_scratch_max_allocation
                    (in_stack_ffffffffffffffc8,(secp256k1_scratch *)in_stack_ffffffffffffffc0,
                     (size_t)in_stack_ffffffffffffffb8);
  if (sVar1 != 0x3d9) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x213,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - (ALIGNMENT - 1)"
           );
    abort();
  }
  if (error_callback->alloc_size != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x214,"test condition failed: scratch->alloc_size == 0");
    abort();
  }
  if ((error_callback->alloc_size & 0xf) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x215,"test condition failed: scratch->alloc_size % ALIGNMENT == 0");
    abort();
  }
  secp256k1_scratch_checkpoint
            ((secp256k1_callback *)in_stack_ffffffffffffffb8,(secp256k1_scratch *)0x110fcc);
  pvVar2 = secp256k1_scratch_alloc
                     ((secp256k1_callback *)error_callback,in_stack_ffffffffffffffd0,
                      (size_t)in_stack_ffffffffffffffc8);
  if (pvVar2 == (void *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x219,
            "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL"
           );
    abort();
  }
  sVar1 = secp256k1_scratch_max_allocation
                    (in_stack_ffffffffffffffc8,(secp256k1_scratch *)in_stack_ffffffffffffffc0,
                     (size_t)in_stack_ffffffffffffffb8);
  if (sVar1 != 0x1e8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x21a,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc"
           );
    abort();
  }
  sVar1 = secp256k1_scratch_max_allocation
                    (in_stack_ffffffffffffffc8,(secp256k1_scratch *)in_stack_ffffffffffffffc0,
                     (size_t)in_stack_ffffffffffffffb8);
  if (sVar1 != 0x1d9) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x21b,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1)"
           );
    abort();
  }
  if (error_callback->alloc_size == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x21c,"test condition failed: scratch->alloc_size != 0");
    abort();
  }
  if ((error_callback->alloc_size & 0xf) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x21d,"test condition failed: scratch->alloc_size % ALIGNMENT == 0");
    abort();
  }
  pvVar2 = secp256k1_scratch_alloc
                     ((secp256k1_callback *)error_callback,in_stack_ffffffffffffffd0,
                      (size_t)in_stack_ffffffffffffffc8);
  if (pvVar2 != (void *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x220,
            "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, 501) == NULL"
           );
    abort();
  }
  sVar1 = secp256k1_scratch_max_allocation
                    (in_stack_ffffffffffffffc8,(secp256k1_scratch *)in_stack_ffffffffffffffc0,
                     (size_t)in_stack_ffffffffffffffb8);
  if (sVar1 != 0x1e8) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x221,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc"
           );
    abort();
  }
  sVar1 = secp256k1_scratch_max_allocation
                    (in_stack_ffffffffffffffc8,(secp256k1_scratch *)in_stack_ffffffffffffffc0,
                     (size_t)in_stack_ffffffffffffffb8);
  if (sVar1 != 0x1d9) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x222,
            "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1)"
           );
    abort();
  }
  if (error_callback->alloc_size == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x223,"test condition failed: scratch->alloc_size != 0");
    abort();
  }
  if ((error_callback->alloc_size & 0xf) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x224,"test condition failed: scratch->alloc_size % ALIGNMENT == 0");
    abort();
  }
  secp256k1_scratch_apply_checkpoint
            ((secp256k1_callback *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x1113be);
  if (error_callback->alloc_size == 0) {
    sVar1 = secp256k1_scratch_max_allocation
                      (in_stack_ffffffffffffffc8,(secp256k1_scratch *)in_stack_ffffffffffffffc0,
                       (size_t)in_stack_ffffffffffffffb8);
    if (sVar1 != 1000) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x229,
              "test condition failed: secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000"
             );
      abort();
    }
    pvVar2 = secp256k1_scratch_alloc
                       ((secp256k1_callback *)error_callback,in_stack_ffffffffffffffd0,
                        (size_t)in_stack_ffffffffffffffc8);
    if (pvVar2 != (void *)0x0) {
      if (error_callback->alloc_size != 0) {
        secp256k1_scratch_checkpoint
                  ((secp256k1_callback *)in_stack_ffffffffffffffb8,(secp256k1_scratch *)0x11154b);
        secp256k1_scratch_apply_checkpoint
                  ((secp256k1_callback *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   0x11156d);
        secp256k1_scratch_apply_checkpoint
                  ((secp256k1_callback *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   0x1115d5);
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x232,"test condition failed: ecount == 1");
        abort();
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x22b,"test condition failed: scratch->alloc_size != 0");
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x22a,
            "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x228,"test condition failed: scratch->alloc_size == 0");
  abort();
}

Assistant:

static void run_scratch_tests(void) {
    const size_t adj_alloc = ((500 + ALIGNMENT - 1) / ALIGNMENT) * ALIGNMENT;

    int32_t ecount = 0;
    size_t checkpoint;
    size_t checkpoint_2;
    secp256k1_scratch_space *scratch;
    secp256k1_scratch_space local_scratch;

    secp256k1_context_set_illegal_callback(CTX, counting_illegal_callback_fn, &ecount);
    secp256k1_context_set_error_callback(CTX, counting_illegal_callback_fn, &ecount);

    /* Test public API */
    scratch = secp256k1_scratch_space_create(CTX, 1000);
    CHECK(scratch != NULL);
    CHECK(ecount == 0);

    /* Test internal API */
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - (ALIGNMENT - 1));
    CHECK(scratch->alloc_size == 0);
    CHECK(scratch->alloc_size % ALIGNMENT == 0);

    /* Allocating 500 bytes succeeds */
    checkpoint = secp256k1_scratch_checkpoint(&CTX->error_callback, scratch);
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1));
    CHECK(scratch->alloc_size != 0);
    CHECK(scratch->alloc_size % ALIGNMENT == 0);

    /* Allocating another 501 bytes fails */
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 501) == NULL);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000 - adj_alloc);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 1) == 1000 - adj_alloc - (ALIGNMENT - 1));
    CHECK(scratch->alloc_size != 0);
    CHECK(scratch->alloc_size % ALIGNMENT == 0);

    /* ...but it succeeds once we apply the checkpoint to undo it */
    secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, checkpoint);
    CHECK(scratch->alloc_size == 0);
    CHECK(secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0) == 1000);
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) != NULL);
    CHECK(scratch->alloc_size != 0);

    /* try to apply a bad checkpoint */
    checkpoint_2 = secp256k1_scratch_checkpoint(&CTX->error_callback, scratch);
    secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, checkpoint);
    CHECK(ecount == 0);
    secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, checkpoint_2); /* checkpoint_2 is after checkpoint */
    CHECK(ecount == 1);
    secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, (size_t) -1); /* this is just wildly invalid */
    CHECK(ecount == 2);

    /* try to use badly initialized scratch space */
    secp256k1_scratch_space_destroy(CTX, scratch);
    memset(&local_scratch, 0, sizeof(local_scratch));
    scratch = &local_scratch;
    CHECK(!secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, 0));
    CHECK(ecount == 3);
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 500) == NULL);
    CHECK(ecount == 4);
    secp256k1_scratch_space_destroy(CTX, scratch);
    CHECK(ecount == 5);

    /* Test that large integers do not wrap around in a bad way */
    scratch = secp256k1_scratch_space_create(CTX, 1000);
    /* Try max allocation with a large number of objects. Only makes sense if
     * ALIGNMENT is greater than 1 because otherwise the objects take no extra
     * space. */
    CHECK(ALIGNMENT <= 1 || !secp256k1_scratch_max_allocation(&CTX->error_callback, scratch, (SIZE_MAX / (ALIGNMENT - 1)) + 1));
    /* Try allocating SIZE_MAX to test wrap around which only happens if
     * ALIGNMENT > 1, otherwise it returns NULL anyway because the scratch
     * space is too small. */
    CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, SIZE_MAX) == NULL);
    secp256k1_scratch_space_destroy(CTX, scratch);

    /* cleanup */
    secp256k1_scratch_space_destroy(CTX, NULL); /* no-op */

    secp256k1_context_set_illegal_callback(CTX, NULL, NULL);
    secp256k1_context_set_error_callback(CTX, NULL, NULL);
}